

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

SamplerHandle __thiscall
pbrt::SamplerHandle::Create
          (SamplerHandle *this,string *name,ParameterDictionary *parameters,Point2i fullResolution,
          FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  HaltonSampler *pHVar2;
  ulong uVar3;
  char *pcVar4;
  Tuple2<pbrt::Point2,_int> local_38;
  
  pcVar4 = "pmj02bn";
  local_38 = fullResolution.super_Tuple2<pbrt::Point2,_int>;
  bVar1 = std::operator==(name,"pmj02bn");
  if (bVar1) {
    pHVar2 = (HaltonSampler *)PMJ02BNSampler::Create(parameters,(FileLoc *)pcVar4,alloc);
    uVar3 = 0x7000000000000;
  }
  else {
    bVar1 = std::operator==(name,"paddedsobol");
    if (bVar1) {
      pHVar2 = (HaltonSampler *)PaddedSobolSampler::Create(parameters,loc,alloc);
      uVar3 = 0x4000000000000;
    }
    else {
      bVar1 = std::operator==(name,"halton");
      if (bVar1) {
        pHVar2 = HaltonSampler::Create(parameters,(Point2i *)&local_38,loc,alloc);
        uVar3 = 0x3000000000000;
      }
      else {
        bVar1 = std::operator==(name,"sobol");
        if (bVar1) {
          pHVar2 = (HaltonSampler *)SobolSampler::Create(parameters,(Point2i *)&local_38,loc,alloc);
          uVar3 = 0x5000000000000;
        }
        else {
          bVar1 = std::operator==(name,"zsobol");
          if (bVar1) {
            pHVar2 = (HaltonSampler *)ZSobolSampler::Create(parameters,fullResolution,loc,alloc);
            uVar3 = 0x6000000000000;
          }
          else {
            pcVar4 = "random";
            bVar1 = std::operator==(name,"random");
            if (bVar1) {
              pHVar2 = (HaltonSampler *)RandomSampler::Create(parameters,(FileLoc *)pcVar4,alloc);
              uVar3 = 0x1000000000000;
            }
            else {
              pcVar4 = "stratified";
              bVar1 = std::operator==(name,"stratified");
              if (!bVar1) {
                pcVar4 = "%s: sampler type unknown.";
                goto LAB_00234590;
              }
              pHVar2 = (HaltonSampler *)
                       StratifiedSampler::Create(parameters,(FileLoc *)pcVar4,alloc);
              uVar3 = 0x2000000000000;
            }
          }
        }
      }
    }
  }
  (this->
  super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  ).bits = uVar3 | (ulong)pHVar2;
  if (((ulong)pHVar2 & 0xffffffffffff) != 0) {
    ParameterDictionary::ReportUnused(parameters);
    return (SamplerHandle)
           (TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
            )this;
  }
  pcVar4 = "%s: unable to create sampler.";
LAB_00234590:
  ErrorExit<std::__cxx11::string_const&>(loc,pcVar4,name);
}

Assistant:

SamplerHandle SamplerHandle::Create(const std::string &name,
                                    const ParameterDictionary &parameters,
                                    Point2i fullResolution, const FileLoc *loc,
                                    Allocator alloc) {
    SamplerHandle sampler = nullptr;
    if (name == "pmj02bn")
        sampler = PMJ02BNSampler::Create(parameters, loc, alloc);
    // Create remainder of _Sampler_ types
    else if (name == "paddedsobol")
        sampler = PaddedSobolSampler::Create(parameters, loc, alloc);
    else if (name == "halton")
        sampler = HaltonSampler::Create(parameters, fullResolution, loc, alloc);
    else if (name == "sobol")
        sampler = SobolSampler::Create(parameters, fullResolution, loc, alloc);
    else if (name == "zsobol")
        sampler = ZSobolSampler::Create(parameters, fullResolution, loc, alloc);
    else if (name == "random")
        sampler = RandomSampler::Create(parameters, loc, alloc);
    else if (name == "stratified")
        sampler = StratifiedSampler::Create(parameters, loc, alloc);
    else
        ErrorExit(loc, "%s: sampler type unknown.", name);

    if (!sampler)
        ErrorExit(loc, "%s: unable to create sampler.", name);
    parameters.ReportUnused();
    return sampler;
}